

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O1

void pztopology::TPZTetrahedron::ComputeHDivDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  int i;
  long lVar6;
  int i_2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  dVar5 = TPZAxesTools<double>::ComputeDetjac(gradx);
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  lVar6 = 0;
  do {
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_d8.super_TPZVec<double>.fStore[lVar6] = gradx->fElem[lVar6] * 6.0;
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_68.super_TPZVec<double>.fStore[lVar6] = gradx->fElem[lVar1 + lVar6] * 6.0;
    if ((lVar1 <= lVar6) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_a0.super_TPZVec<double>.fStore[lVar6] =
         gradx->fElem[(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + lVar6] * 6.0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    local_d8.super_TPZVec<double>.fStore[lVar6] =
         local_d8.super_TPZVec<double>.fStore[lVar6] / dVar5;
    local_68.super_TPZVec<double>.fStore[lVar6] =
         local_68.super_TPZVec<double>.fStore[lVar6] / dVar5;
    local_a0.super_TPZVec<double>.fStore[lVar6] =
         local_a0.super_TPZVec<double>.fStore[lVar6] / dVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  while( true ) {
    if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
       ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    directions->fElem[lVar6] = -local_a0.super_TPZVec<double>.fStore[lVar6];
    if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
       ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 + lVar6] =
         local_d8.super_TPZVec<double>.fStore[lVar6] - local_a0.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 2 + lVar6] =
         local_68.super_TPZVec<double>.fStore[lVar6] - local_a0.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
       ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 3 + lVar6] =
         (directions->fElem[lVar6] + directions->fElem[lVar1 + lVar6]) * 0.5;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 4 + lVar6] =
         (directions->fElem[lVar1 + lVar6] + directions->fElem[lVar2 * 2 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
       ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar2 * 5 + lVar6] =
         (directions->fElem[lVar6] + directions->fElem[lVar1 * 2 + lVar6]) * 0.5;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 6 + lVar6] =
         (directions->fElem[lVar1 * 3 + lVar6] + directions->fElem[lVar2 * 4 + lVar6] +
         directions->fElem[lVar3 * 5 + lVar6]) / 3.0;
    if ((lVar4 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 7 + lVar6] = -local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 8 + lVar6] =
         local_d8.super_TPZVec<double>.fStore[lVar6] - local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 9 + lVar6] =
         local_a0.super_TPZVec<double>.fStore[lVar6] - local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xb))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 10 + lVar6] =
         (directions->fElem[lVar1 * 7 + lVar6] + directions->fElem[lVar2 * 8 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0xb + lVar6] =
         (directions->fElem[lVar1 * 8 + lVar6] + directions->fElem[lVar2 * 9 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xd))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0xc + lVar6] =
         (directions->fElem[lVar1 * 7 + lVar6] + directions->fElem[lVar2 * 9 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xb))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xd))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0xd + lVar6] =
         (directions->fElem[lVar1 * 10 + lVar6] + directions->fElem[lVar2 * 0xb + lVar6] +
         directions->fElem[lVar3 * 0xc + lVar6]) / 3.0;
    if ((lVar4 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xf))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0xe + lVar6] = local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x10))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0xf + lVar6] = local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x11))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x10 + lVar6] = local_a0.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xf))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x10))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x12))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0x11 + lVar6] =
         (directions->fElem[lVar1 * 0xe + lVar6] + directions->fElem[lVar2 * 0xf + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x10))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x11))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0x12 + lVar6] =
         (directions->fElem[lVar1 * 0xf + lVar6] + directions->fElem[lVar2 * 0x10 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xf))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x11))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x14))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0x13 + lVar6] =
         (directions->fElem[lVar1 * 0xe + lVar6] + directions->fElem[lVar2 * 0x10 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x12))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x14))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x15))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x14 + lVar6] =
         (directions->fElem[lVar1 * 0x11 + lVar6] + directions->fElem[lVar2 * 0x12 + lVar6] +
         directions->fElem[lVar3 * 0x13 + lVar6]) / 3.0;
    if ((lVar4 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x16))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x15 + lVar6] = -local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x17))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x16 + lVar6] =
         local_68.super_TPZVec<double>.fStore[lVar6] - local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x18))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x17 + lVar6] =
         local_a0.super_TPZVec<double>.fStore[lVar6] - local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x16))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x17))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x19))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0x18 + lVar6] =
         (directions->fElem[lVar1 * 0x15 + lVar6] + directions->fElem[lVar2 * 0x16 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x17))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x18))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0x19 + lVar6] =
         (directions->fElem[lVar1 * 0x16 + lVar6] + directions->fElem[lVar2 * 0x17 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x16))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x18))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar3 * 0x1a + lVar6] =
         (directions->fElem[lVar1 * 0x15 + lVar6] + directions->fElem[lVar2 * 0x17 + lVar6]) * 0.5;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x19))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar3 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1c))
    break;
    lVar4 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar4 * 0x1b + lVar6] =
         (directions->fElem[lVar1 * 0x18 + lVar6] + directions->fElem[lVar2 * 0x19 + lVar6] +
         directions->fElem[lVar3 * 0x1a + lVar6]) / 3.0;
    if ((lVar4 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x1c + lVar6] = local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1e))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x1d + lVar6] =
         local_68.super_TPZVec<double>.fStore[lVar6] - local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x1e + lVar6] = -local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x20))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x1f + lVar6] = local_a0.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x20 + lVar6] =
         local_a0.super_TPZVec<double>.fStore[lVar6] - local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x22))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x21 + lVar6] =
         local_a0.super_TPZVec<double>.fStore[lVar6] - local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x23))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x22 + lVar6] = local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x24))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x23 + lVar6] = local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x25))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x24 + lVar6] = local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x26))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x25 + lVar6] = local_a0.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x27))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x26 + lVar6] =
         local_68.super_TPZVec<double>.fStore[lVar6] - local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x28))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x27 + lVar6] =
         local_a0.super_TPZVec<double>.fStore[lVar6] - local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x29))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x28 + lVar6] = local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x29 + lVar6] = local_a0.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x2a + lVar6] = local_d8.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x2b + lVar6] = local_68.super_TPZVec<double>.fStore[lVar6];
    if ((lVar1 <= lVar6) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    directions->fElem[(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x2c + lVar6]
         = local_a0.super_TPZVec<double>.fStore[lVar6];
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
      TPZManVector<double,_3>::~TPZManVector(&local_a0);
      TPZManVector<double,_3>::~TPZManVector(&local_68);
      TPZManVector<double,_3>::~TPZManVector(&local_d8);
      return;
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZTetrahedron::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3);
        
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0)*6.;
            v2[i] = gradx(i,1)*6.;
            v3[i] = gradx(i,2)*6.;
        }
        
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        
        {
            // the above constants are wrong
            for (int i=0; i<3; i++) {
                v1[i] /= detjac;
                v2[i] /= detjac;
                v3[i] /= detjac;
            }
            for (int i=0; i<3; i++)
            {
                
                //face 0
                directions(i,0) = -v3[i];
                directions(i,1) = (v1[i]-v3[i]);
                directions(i,2) = (v2[i]-v3[i]);
                directions(i,3) = (directions(i,0)+directions(i,1))/2.;
                directions(i,4) = (directions(i,1)+directions(i,2))/2.;
                directions(i,5) = (directions(i,0)+directions(i,2))/2.;
                directions(i,6) = (directions(i,3)+directions(i,4)+directions(i,5))/3.;
                //face 1
                directions(i,7) = -v2[i];
                directions(i,8) = (v1[i]-v2[i]);
                directions(i,9) = (v3[i]-v2[i]);
                directions(i,10) = (directions(i,7)+directions(i,8))/2.;
                directions(i,11) = (directions(i,8)+directions(i,9))/2.;
                directions(i,12) = (directions(i,7)+directions(i,9))/2.;
                directions(i,13) = (directions(i,10)+directions(i,11)+directions(i,12))/3.;
                //face 2 face diagonal
                
                directions(i,14) = v1[i];
                directions(i,15) = v2[i];
                directions(i,16) = v3[i];
                directions(i,17) = (directions(i,14)+directions(i,15))/2.;
                directions(i,18) = (directions(i,15)+directions(i,16))/2.;
                directions(i,19) = (directions(i,14)+directions(i,16))/2.;
                directions(i,20) = (directions(i,17)+directions(i,18)+directions(i,19))/3.;
                //face 3
                directions(i,21) = -v1[i];
                directions(i,22) = (v2[i]-v1[i]);
                directions(i,23) = (v3[i]-v1[i]);
                directions(i,24) = (directions(i,21)+directions(i,22))/2.;
                directions(i,25) = (directions(i,22)+directions(i,23))/2.;
                directions(i,26) = (directions(i,21)+directions(i,23))/2.;
                directions(i,27) = (directions(i,24)+directions(i,25)+directions(i,26))/3.;
                
                //arestas
                directions(i,28) = v1[i];
                directions(i,29) = (v2[i]-v1[i]);
                directions(i,30) = -v2[i];
                directions(i,31) = v3[i];
                directions(i,32) = (v3[i]-v1[i]);
                directions(i,33) = (v3[i]-v2[i]);
                
                //faces
                directions(i,34) = v1[i];
                directions(i,35) = v2[i];
                directions(i,36) = v1[i];
                directions(i,37) = v3[i];
                directions(i,38) = (v2[i]-v1[i]);
                directions(i,39) = (v3[i]-v1[i]);//v3[i]-0.5*(v1[i]+v2[i]);//
                directions(i,40) = v2[i];
                directions(i,41) = v3[i];
                
                directions(i,42) = v1[i];
                directions(i,43) = v2[i];
                directions(i,44) = v3[i];
                
            }        

        } 

    }